

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearDecayCorrelationModel.cpp
# Opt level: O0

void __thiscall
csm::LinearDecayCorrelationModel::setCorrelationGroupParameters
          (LinearDecayCorrelationModel *this,size_t cpGroupIndex,Parameters *params)

{
  Parameters *pPVar1;
  size_type sVar2;
  size_type sVar3;
  Error *pEVar4;
  const_reference pvVar5;
  reference this_00;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  ErrorType local_188;
  undefined1 local_182;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  ErrorType local_138;
  undefined1 local_132;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  ErrorType local_e4;
  ulong local_e0;
  size_t i;
  double prevTime;
  double time;
  double prevCorr;
  double corr;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  ErrorType local_64;
  ulong local_60;
  size_t size;
  allocator<char> local_41;
  string local_40;
  Parameters *local_20;
  Parameters *params_local;
  size_t cpGroupIndex_local;
  LinearDecayCorrelationModel *this_local;
  
  local_20 = params;
  params_local = (Parameters *)cpGroupIndex;
  cpGroupIndex_local = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"setCorrelationGroupParameters",&local_41);
  checkParameterGroupIndex(this,cpGroupIndex,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(&local_20->theInitialCorrsPerSegment);
  local_60 = sVar2;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_20->theTimesPerSegment);
  if (sVar2 != sVar3) {
    corr._6_1_ = 1;
    pEVar4 = (Error *)__cxa_allocate_exception(0x50);
    local_64 = BOUNDS;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Must have equal number of correlations and times.",&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"csm::LinearDecayCorrelationModel::setCorrelationGroupParameters"
               ,(allocator<char> *)((long)&corr + 7));
    Error::Error(pEVar4,&local_64,&local_88,&local_b0);
    corr._6_1_ = 0;
    __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
  }
  if (1 < local_60) {
    for (local_e0 = 0; local_e0 < local_60; local_e0 = local_e0 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_20->theInitialCorrsPerSegment,local_e0);
      prevCorr = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_20->theTimesPerSegment,local_e0);
      prevTime = *pvVar5;
      if ((prevCorr < 0.0) || (1.0 < prevCorr)) {
        local_132 = 1;
        pEVar4 = (Error *)__cxa_allocate_exception(0x50);
        local_e4 = BOUNDS;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"Correlation must be in range [0..1].",&local_109);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,
                   "csm::LinearDecayCorrelationModel::setCorrelationGroupParameters",&local_131);
        Error::Error(pEVar4,&local_e4,&local_108,&local_130);
        local_132 = 0;
        __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
      }
      if (local_e0 != 0) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_20->theInitialCorrsPerSegment,local_e0 - 1);
        time = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_20->theTimesPerSegment,local_e0 - 1);
        i = (size_t)*pvVar5;
        if (time < prevCorr) {
          local_182 = 1;
          pEVar4 = (Error *)__cxa_allocate_exception(0x50);
          local_138 = BOUNDS;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_158,"Correlation must be monotomically decreasing.",&local_159
                    );
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_180,
                     "csm::LinearDecayCorrelationModel::setCorrelationGroupParameters",&local_181);
          Error::Error(pEVar4,&local_138,&local_158,&local_180);
          local_182 = 0;
          __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
        }
        if (prevTime < (double)i) {
          pEVar4 = (Error *)__cxa_allocate_exception(0x50);
          local_188 = BOUNDS;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a8,"Time must be monotomically increasing.",&local_1a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,
                     "csm::LinearDecayCorrelationModel::setCorrelationGroupParameters",&local_1d1);
          Error::Error(pEVar4,&local_188,&local_1a8,&local_1d0);
          __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
        }
      }
    }
  }
  pPVar1 = local_20;
  this_00 = std::
            vector<csm::LinearDecayCorrelationModel::Parameters,_std::allocator<csm::LinearDecayCorrelationModel::Parameters>_>
            ::operator[](&this->theCorrParams,(size_type)params_local);
  Parameters::operator=(this_00,pPVar1);
  return;
}

Assistant:

void LinearDecayCorrelationModel::setCorrelationGroupParameters(
   size_t            cpGroupIndex,
   const Parameters& params)
{
   static const char* const MODULE =
      "csm::LinearDecayCorrelationModel::setCorrelationGroupParameters";

   // make sure the index falls within the acceptable range
   checkParameterGroupIndex(cpGroupIndex, "setCorrelationGroupParameters");

   // make sure the values of each correlation model parameter
   // fall within acceptable ranges
   size_t size = params.theInitialCorrsPerSegment.size();
   if (size != params.theTimesPerSegment.size())
   {
      throw Error(
         Error::BOUNDS,
         "Must have equal number of correlations and times.",
         MODULE);
   }

   double corr, prevCorr;
   double time, prevTime;

   if (size > 1)
   {
      for(size_t i = 0; i < size; ++i)
      {
         corr = params.theInitialCorrsPerSegment[i];
         time = params.theTimesPerSegment[i];
         if (corr < 0.0 || corr > 1.0)
         {
            throw Error(
               Error::BOUNDS,
               "Correlation must be in range [0..1].",
               MODULE);
         }

         if (i > 0)
         {
            prevCorr = params.theInitialCorrsPerSegment[i-1];
            prevTime = params.theTimesPerSegment[i-1];
            if (corr > prevCorr)
            {
               throw Error(
                  Error::BOUNDS,
                  "Correlation must be monotomically decreasing.",
                  MODULE);
            }
            if (time < prevTime)
            {
               throw Error(
                  Error::BOUNDS,
                  "Time must be monotomically increasing.",
                  MODULE);
            }
         }
      }
   }

   // store the correlation parameter values
   theCorrParams[cpGroupIndex] = params;
}